

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t nblimbs;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (X != Y) {
    if (Y->n == 0) {
      if (X->n != 0) {
        X->s = 1;
        memset(X->p,0,(ulong)X->n << 3);
      }
    }
    else {
      uVar1 = Y->n - 1;
      uVar3 = (ulong)uVar1;
      if (uVar1 != 0) {
        do {
          if (Y->p[uVar3] != 0) goto LAB_004a5df0;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      uVar3 = 0;
LAB_004a5df0:
      nblimbs = uVar3 + 1;
      X->s = Y->s;
      if (uVar3 < X->n) {
        memset(X->p + nblimbs,0,(X->n - nblimbs) * 8);
      }
      else {
        iVar2 = mbedtls_mpi_grow(X,nblimbs);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      memcpy(X->p,Y->p,nblimbs * 8);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_copy(mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    int ret = 0;
    size_t i;

    if (X == Y) {
        return 0;
    }

    if (Y->n == 0) {
        if (X->n != 0) {
            X->s = 1;
            memset(X->p, 0, X->n * ciL);
        }
        return 0;
    }

    for (i = Y->n - 1; i > 0; i--) {
        if (Y->p[i] != 0) {
            break;
        }
    }
    i++;

    X->s = Y->s;

    if (X->n < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i));
    } else {
        memset(X->p + i, 0, (X->n - i) * ciL);
    }

    memcpy(X->p, Y->p, i * ciL);

cleanup:

    return ret;
}